

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSetupColumnFlags
               (ImGuiTable *table,ImGuiTableColumn *column,ImGuiTableColumnFlags flags_in)

{
  int iVar1;
  uint in_EDX;
  ImGuiTableColumn *in_RSI;
  long in_RDI;
  int list;
  int mask;
  int count;
  ImGuiTableFlags table_sizing_policy;
  ImGuiTableColumnFlags flags;
  uint uVar2;
  uint uVar3;
  uint in_stack_ffffffffffffffe4;
  uint local_18;
  
  local_18 = in_EDX;
  if ((in_EDX & 0xc) == 0) {
    in_stack_ffffffffffffffe4 = *(uint *)(in_RDI + 4) & 0xe000;
    if ((in_stack_ffffffffffffffe4 == 0x2000) || (in_stack_ffffffffffffffe4 == 0x4000)) {
      local_18 = in_EDX | 8;
    }
    else {
      local_18 = in_EDX | 4;
    }
  }
  if ((*(uint *)(in_RDI + 4) & 1) == 0) {
    local_18 = local_18 | 0x10;
  }
  if (((local_18 & 0x200) != 0) && ((local_18 & 0x400) != 0)) {
    local_18 = local_18 | 0x100;
  }
  if ((local_18 & 0xc000) == 0) {
    iVar1 = ImSpan<ImGuiTableColumn>::index_from_ptr
                      ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),in_RSI);
    uVar2 = 0x8000;
    if (iVar1 == 0) {
      uVar2 = 0x4000;
    }
    local_18 = uVar2 | local_18;
  }
  in_RSI->Flags = local_18 | in_RSI->Flags & 0xf00000U;
  in_RSI->SortDirectionsAvailList = '\0';
  in_RSI->field_0x64 = in_RSI->field_0x64 & 0xf;
  in_RSI->field_0x64 = in_RSI->field_0x64 & 0xf3;
  if ((*(uint *)(in_RDI + 4) & 8) != 0) {
    iVar1 = 0;
    uVar3 = 0;
    uVar2 = 0;
    if (((local_18 & 0x1000) != 0) && ((local_18 & 0x200) == 0)) {
      uVar3 = 2;
      uVar2 = 1;
      iVar1 = 1;
    }
    if (((local_18 & 0x2000) != 0) && ((local_18 & 0x400) == 0)) {
      uVar3 = uVar3 | 4;
      uVar2 = 2 << (sbyte)(iVar1 << 1) | uVar2;
      iVar1 = iVar1 + 1;
    }
    if (((local_18 & 0x1000) == 0) && ((local_18 & 0x200) == 0)) {
      uVar3 = uVar3 | 2;
      uVar2 = 1 << (sbyte)(iVar1 << 1) | uVar2;
      iVar1 = iVar1 + 1;
    }
    if (((local_18 & 0x2000) == 0) && ((local_18 & 0x400) == 0)) {
      uVar3 = uVar3 | 4;
      uVar2 = 2 << (sbyte)(iVar1 << 1) | uVar2;
      iVar1 = iVar1 + 1;
    }
    if (((*(uint *)(in_RDI + 4) & 0x8000000) != 0) || (iVar1 == 0)) {
      uVar3 = uVar3 | 1;
      iVar1 = iVar1 + 1;
    }
    in_RSI->SortDirectionsAvailList = (ImU8)uVar2;
    in_RSI->field_0x64 = in_RSI->field_0x64 & 0xf | (char)uVar3 << 4;
    in_RSI->field_0x64 = in_RSI->field_0x64 & 0xf3 | ((byte)iVar1 & 3) << 2;
    ImGui::TableFixColumnSortDirection
              ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
               (ImGuiTableColumn *)CONCAT44(uVar3,uVar2));
  }
  return;
}

Assistant:

static void TableSetupColumnFlags(ImGuiTable* table, ImGuiTableColumn* column, ImGuiTableColumnFlags flags_in)
{
    ImGuiTableColumnFlags flags = flags_in;

    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
        if (table_sizing_policy == ImGuiTableFlags_SizingFixedFit || table_sizing_policy == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    else
    {
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    }
    
    // Resize
    if ((table->Flags & ImGuiTableFlags_Resizable) == 0)
        flags |= ImGuiTableColumnFlags_NoResize;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Indentation
    if ((flags & ImGuiTableColumnFlags_IndentMask_) == 0)
        flags |= (table->Columns.index_from_ptr(column) == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    // Preserve status flags
    column->Flags = flags | (column->Flags & ImGuiTableColumnFlags_StatusMask_);

    // Build an ordered list of available sort directions
    column->SortDirectionsAvailCount = column->SortDirectionsAvailMask = column->SortDirectionsAvailList = 0;
    if (table->Flags & ImGuiTableFlags_Sortable)
    {
        int count = 0, mask = 0, list = 0;
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  != 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) != 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  == 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) == 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((table->Flags & ImGuiTableFlags_SortTristate) || count == 0) { mask |= 1 << ImGuiSortDirection_None; count++; }
        column->SortDirectionsAvailList = (ImU8)list;
        column->SortDirectionsAvailMask = (ImU8)mask;
        column->SortDirectionsAvailCount = (ImU8)count;
        ImGui::TableFixColumnSortDirection(table, column);
    }
}